

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  uint uVar1;
  pointer pPVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  TextureCube *this_01;
  ulong uVar5;
  long extraout_RAX;
  long lVar6;
  NotSupportedError *this_02;
  long lVar7;
  ulong uVar8;
  deUint32 step;
  RGBA local_1cc;
  ulong local_1c8;
  long local_1c0;
  long local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((char)iVar3 == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Warning: High precision not supported in fragment shaders.",0x3a)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])(),
     0 < *(int *)(CONCAT44(extraout_var,iVar3) + 0x20))) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Projected lookup validation not supported in multisample config"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_01 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_01;
  uVar1 = this->m_size;
  if (uVar1 == 0) {
    uVar4 = 0x20;
  }
  else {
    uVar4 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  uVar8 = 0;
  uVar5 = 0;
  if (0 < (int)(0x1f - uVar4)) {
    uVar5 = (ulong)(0x1f - uVar4);
  }
  lVar6 = uVar5 * 0x28 + 0x28;
  local_1c0 = lVar6;
  do {
    if (uVar1 != 0) {
      local_1c8 = uVar8 & 0xffffffff;
      local_1b8 = uVar8 * 3;
      lVar7 = 0;
      iVar3 = 0;
      do {
        if ((CubeFace)uVar8 < CUBEFACE_LAST) {
          iVar3 = (*(code *)(&DAT_0063f200 + *(int *)(&DAT_0063f200 + local_1c8 * 4)))();
          return iVar3;
        }
        tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar8,iVar3);
        pPVar2 = (&(this->m_texture->m_refTexture).m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)[local_1b8];
        local_1cc.m_value = 0xff000000;
        tcu::RGBA::toVec(&local_1cc);
        tcu::clear((PixelBufferAccess *)
                   ((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data + lVar7 + -8),
                   (Vec4 *)local_1b0);
        iVar3 = iVar3 + 1;
        lVar7 = lVar7 + 0x28;
        lVar6 = extraout_RAX;
      } while (local_1c0 != lVar7);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 6);
  return (int)lVar6;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}